

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

void __thiscall deqp::gles31::Functional::anon_unknown_1::ClearCase::deinit(ClearCase *this)

{
  pointer pDVar1;
  pointer pDVar2;
  pointer pVVar3;
  pointer pVVar4;
  
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  ::reset(&(this->m_vbo).
           super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
         );
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
            (&(this->m_perPrimitiveProgram).
              super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>);
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
            (&(this->m_basicProgram).
              super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>);
  pDVar1 = (this->m_drawObjects).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar2 = (this->m_drawObjects).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_drawObjects).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_drawObjects).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_drawObjects).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pDVar1 != (pointer)0x0) {
    operator_delete(pDVar1,(long)pDVar2 - (long)pDVar1);
  }
  pVVar3 = (this->m_objectVertices).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar4 = (this->m_objectVertices).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_objectVertices).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_objectVertices).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_objectVertices).
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pVVar3 != (pointer)0x0) {
    operator_delete(pVVar3,(long)pVVar4 - (long)pVVar3);
    return;
  }
  return;
}

Assistant:

void ClearCase::deinit (void)
{
	m_vbo.clear();
	m_perPrimitiveProgram.clear();
	m_basicProgram.clear();
	m_drawObjects = std::vector<DrawObject>();
	m_objectVertices = std::vector<tcu::Vec4>();
}